

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O0

Status __thiscall leveldb::log::LogTest::StringDest::Append(StringDest *this,Slice *slice)

{
  char *pcVar1;
  Slice *in_RDX;
  Slice *slice_local;
  StringDest *this_local;
  
  pcVar1 = Slice::data(in_RDX);
  Slice::size(in_RDX);
  std::__cxx11::string::append((char *)&slice->size_,(ulong)pcVar1);
  Status::OK();
  return (Status)(char *)this;
}

Assistant:

Status Append(const Slice& slice) override {
      contents_.append(slice.data(), slice.size());
      return Status::OK();
    }